

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O0

RPCHelpMan * verifymessage(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff4a8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4e0;
  allocator<char> *in_stack_fffffffffffff4e8;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff4f0;
  RPCArgOptions *in_stack_fffffffffffff4f8;
  string *in_stack_fffffffffffff500;
  Fallback *in_stack_fffffffffffff508;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff510;
  string *in_stack_fffffffffffff518;
  RPCArg *in_stack_fffffffffffff520;
  RPCResults *in_stack_fffffffffffff528;
  RPCResult *in_stack_fffffffffffff530;
  RPCHelpMan *examples;
  RPCResults *in_stack_fffffffffffff5f8;
  _Alloc_hider in_stack_fffffffffffff600;
  string *in_stack_fffffffffffff608;
  undefined8 in_stack_fffffffffffff610;
  undefined8 in_stack_fffffffffffff618;
  allocator<char> local_9e0;
  allocator<char> local_9df;
  allocator<char> local_9de;
  allocator<char> local_9dd;
  allocator<char> local_9dc;
  allocator<char> local_9db;
  allocator<char> local_9da;
  allocator<char> local_9d9;
  pointer local_9d8;
  pointer pRStack_9d0;
  pointer local_9c8;
  allocator<char> local_9ba;
  allocator<char> local_9b9 [32];
  allocator<char> local_999 [7];
  allocator<char> local_992;
  allocator<char> local_991 [7];
  allocator<char> local_98a;
  allocator<char> local_989 [8];
  allocator<char> local_981 [31];
  allocator<char> local_962;
  allocator<char> local_961 [113];
  RPCMethodImpl *in_stack_fffffffffffff710;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  examples = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  local_989[1] = (allocator<char>)0x0;
  local_989[2] = (allocator<char>)0x0;
  local_989[3] = (allocator<char>)0x0;
  local_989[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4b8,(Optional *)in_stack_fffffffffffff4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::__cxx11::string::string(in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4a8);
  RPCArg::RPCArg(in_stack_fffffffffffff520,in_stack_fffffffffffff518,
                 (Type)((ulong)in_stack_fffffffffffff510 >> 0x20),in_stack_fffffffffffff508,
                 in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  local_991[1] = (allocator<char>)0x0;
  local_991[2] = (allocator<char>)0x0;
  local_991[3] = (allocator<char>)0x0;
  local_991[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4b8,(Optional *)in_stack_fffffffffffff4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::__cxx11::string::string(in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4a8);
  RPCArg::RPCArg(in_stack_fffffffffffff520,in_stack_fffffffffffff518,
                 (Type)((ulong)in_stack_fffffffffffff510 >> 0x20),in_stack_fffffffffffff508,
                 in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  local_999[1] = (allocator<char>)0x0;
  local_999[2] = (allocator<char>)0x0;
  local_999[3] = (allocator<char>)0x0;
  local_999[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4b8,(Optional *)in_stack_fffffffffffff4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::__cxx11::string::string(in_stack_fffffffffffff4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff4a8);
  RPCArg::RPCArg(in_stack_fffffffffffff520,in_stack_fffffffffffff518,
                 (Type)((ulong)in_stack_fffffffffffff510 >> 0x20),in_stack_fffffffffffff508,
                 in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff508 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff4a8);
  __l._M_len = (size_type)in_stack_fffffffffffff4f8;
  __l._M_array = in_stack_fffffffffffff4f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4e8,__l,
             (allocator_type *)in_stack_fffffffffffff4e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  local_9d8 = (pointer)0x0;
  pRStack_9d0 = (pointer)0x0;
  local_9c8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4a8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff530,(Type)((ulong)in_stack_fffffffffffff528 >> 0x20),
             &in_stack_fffffffffffff520->m_names,in_stack_fffffffffffff518,in_stack_fffffffffffff510
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff528,(RPCResult *)in_stack_fffffffffffff520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  HelpExampleCli(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  std::operator+((char *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  std::operator+(in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  HelpExampleCli(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  std::operator+(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  std::operator+(in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  HelpExampleCli(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  std::operator+(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  std::operator+(in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  HelpExampleRpc(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  std::operator+(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff4a8,(string *)0x13fe226);
  this = (RPCArg *)&stack0xfffffffffffff600;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<verifymessage()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff618,(string *)in_stack_fffffffffffff610,
             in_stack_fffffffffffff608,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff600._M_p,
             in_stack_fffffffffffff5f8,(RPCExamples *)examples,in_stack_fffffffffffff710);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9e0);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9df);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9de);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9dd);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9dc);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9db);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9d9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4b8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9b9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_999);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_992);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_991);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_98a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_989);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_981);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_962);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_961);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan verifymessage()
{
    return RPCHelpMan{"verifymessage",
        "Verify a signed message.",
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address to use for the signature."},
            {"signature", RPCArg::Type::STR, RPCArg::Optional::NO, "The signature provided by the signer in base 64 encoding (see signmessage)."},
            {"message", RPCArg::Type::STR, RPCArg::Optional::NO, "The message that was signed."},
        },
        RPCResult{
            RPCResult::Type::BOOL, "", "If the signature is verified or not."
        },
        RPCExamples{
            "\nUnlock the wallet for 30 seconds\n"
            + HelpExampleCli("walletpassphrase", "\"mypassphrase\" 30") +
            "\nCreate the signature\n"
            + HelpExampleCli("signmessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\" \"my message\"") +
            "\nVerify the signature\n"
            + HelpExampleCli("verifymessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\" \"signature\" \"my message\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("verifymessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\", \"signature\", \"my message\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::string strAddress = self.Arg<std::string>("address");
            std::string strSign = self.Arg<std::string>("signature");
            std::string strMessage = self.Arg<std::string>("message");

            switch (MessageVerify(strAddress, strSign, strMessage)) {
            case MessageVerificationResult::ERR_INVALID_ADDRESS:
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address");
            case MessageVerificationResult::ERR_ADDRESS_NO_KEY:
                throw JSONRPCError(RPC_TYPE_ERROR, "Address does not refer to key");
            case MessageVerificationResult::ERR_MALFORMED_SIGNATURE:
                throw JSONRPCError(RPC_TYPE_ERROR, "Malformed base64 encoding");
            case MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED:
            case MessageVerificationResult::ERR_NOT_SIGNED:
                return false;
            case MessageVerificationResult::OK:
                return true;
            }

            return false;
        },
    };
}